

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O2

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)

{
  long lVar1;
  int *piVar2;
  N_Vector *pp_Var3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (S == (SUNLinearSolver)0x0) {
    return -0x321;
  }
  piVar2 = (int *)S->content;
  if (piVar2[3] < 0) {
    piVar2[3] = 0;
  }
  if (*(long *)(piVar2 + 10) == 0) {
    iVar5 = -0x324;
    goto LAB_004bfd59;
  }
  if (piVar2[1] - 1U < 3) {
    if (*(long *)(piVar2 + 0x10) == 0) {
      iVar5 = -0x327;
      goto LAB_004bfd59;
    }
  }
  else {
    piVar2[1] = 0;
  }
  if (*(long *)(piVar2 + 0x18) == 0) {
    pp_Var3 = N_VCloneVectorArray(*piVar2 + 1,*(N_Vector *)(piVar2 + 0x22));
    *(N_Vector **)(piVar2 + 0x18) = pp_Var3;
    if (pp_Var3 != (N_Vector *)0x0) goto LAB_004bfc5f;
LAB_004bfcfc:
    iVar5 = -0x323;
  }
  else {
LAB_004bfc5f:
    if (*(long *)(piVar2 + 0x1a) == 0) {
      lVar6 = (long)*piVar2;
      pvVar4 = malloc(lVar6 * 8 + 8);
      *(void **)(piVar2 + 0x1a) = pvVar4;
      iVar5 = -0x323;
      if (pvVar4 != (void *)0x0) {
        lVar7 = 0;
        do {
          if (lVar6 < lVar7) goto LAB_004bfc6a;
          *(undefined8 *)((long)pvVar4 + lVar7 * 8) = 0;
          pvVar4 = malloc(lVar6 * 8);
          *(void **)(*(long *)(piVar2 + 0x1a) + lVar7 * 8) = pvVar4;
          pvVar4 = *(void **)(piVar2 + 0x1a);
          lVar1 = lVar7 * 8;
          lVar7 = lVar7 + 1;
        } while (*(long *)((long)pvVar4 + lVar1) != 0);
      }
      goto LAB_004bfd59;
    }
LAB_004bfc6a:
    if (*(long *)(piVar2 + 0x1c) == 0) {
      pvVar4 = malloc((long)*piVar2 << 4);
      *(void **)(piVar2 + 0x1c) = pvVar4;
      if (pvVar4 == (void *)0x0) goto LAB_004bfcfc;
    }
    if (*(long *)(piVar2 + 0x20) == 0) {
      pvVar4 = malloc((long)*piVar2 * 8 + 8);
      *(void **)(piVar2 + 0x20) = pvVar4;
      if (pvVar4 == (void *)0x0) goto LAB_004bfcfc;
    }
    if (*(long *)(piVar2 + 0x24) == 0) {
      pvVar4 = malloc((long)*piVar2 * 8 + 8);
      *(void **)(piVar2 + 0x24) = pvVar4;
      if (pvVar4 == (void *)0x0) goto LAB_004bfcfc;
    }
    if (*(long *)(piVar2 + 0x26) == 0) {
      pvVar4 = malloc((long)*piVar2 * 8 + 8);
      *(void **)(piVar2 + 0x26) = pvVar4;
      if (pvVar4 == (void *)0x0) goto LAB_004bfcfc;
    }
    iVar5 = 0;
  }
LAB_004bfd59:
  piVar2[8] = iVar5;
  return iVar5;
}

Assistant:

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)
{
  int k;
  SUNLinearSolverContent_SPGMR content;

  /* set shortcut to SPGMR memory structure */
  if (S == NULL) return(SUNLS_MEM_NULL);
  content = SPGMR_CONTENT(S);

  /* ensure valid options */
  if (content->max_restarts < 0)
    content->max_restarts = SUNSPGMR_MAXRS_DEFAULT;

  if (content->ATimes == NULL) {
    LASTFLAG(S) = SUNLS_ATIMES_NULL;
    return(LASTFLAG(S));
  }

  if ( (content->pretype != SUN_PREC_LEFT) &&
       (content->pretype != SUN_PREC_RIGHT) &&
       (content->pretype != SUN_PREC_BOTH) )
    content->pretype = SUN_PREC_NONE;

  if ((content->pretype != SUN_PREC_NONE) && (content->Psolve == NULL)) {
    LASTFLAG(S) = SUNLS_PSOLVE_NULL;
    return(LASTFLAG(S));
  }

  /* allocate solver-specific memory (where the size depends on the
     choice of maxl) here */

  /*   Krylov subspace vectors */
  if (content->V == NULL) {
    content->V = N_VCloneVectorArray(content->maxl+1, content->vtemp);
    if (content->V == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*   Hessenberg matrix Hes */
  if (content->Hes == NULL) {
    content->Hes = (realtype **) malloc((content->maxl+1)*sizeof(realtype *));
    if (content->Hes == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }

    for (k=0; k<=content->maxl; k++) {
      content->Hes[k] = NULL;
      content->Hes[k] = (realtype *) malloc(content->maxl*sizeof(realtype));
      if (content->Hes[k] == NULL) {
        content->last_flag = SUNLS_MEM_FAIL;
        return(SUNLS_MEM_FAIL);
      }
    }
  }

  /*   Givens rotation components */
  if (content->givens == NULL) {
    content->givens = (realtype *) malloc(2*content->maxl*sizeof(realtype));
    if (content->givens == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    y and g vectors */
  if (content->yg == NULL) {
    content->yg = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->yg == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    cv vector for fused vector ops */
  if (content->cv == NULL) {
    content->cv = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->cv == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    Xv vector for fused vector ops */
  if (content->Xv == NULL) {
    content->Xv = (N_Vector *) malloc((content->maxl+1)*sizeof(N_Vector));
    if (content->Xv == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /* return with success */
  content->last_flag = SUNLS_SUCCESS;
  return(SUNLS_SUCCESS);
}